

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O3

tokens __thiscall
Scanner<UTF8EncodingPolicyBase<false>>::ScanStringConstant<false,false>
          (Scanner<UTF8EncodingPolicyBase<false>> *this,OLECHAR delim,EncodedCharPtr *pp)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  byte *pbVar4;
  byte *end;
  Token *pTVar5;
  code *pcVar6;
  Scanner<UTF8EncodingPolicyBase<false>_> *pSVar7;
  bool bVar8;
  char16 cVar9;
  BOOL BVar10;
  undefined4 *puVar11;
  IdentPtr pIVar12;
  uint32 cch;
  HRESULT hr;
  EncodedCharPtr s;
  undefined1 (*prgch) [16];
  uint uVar13;
  uint ch_00;
  uint uVar14;
  int iVar15;
  char16 local_4a;
  Scanner<UTF8EncodingPolicyBase<false>_> *pSStack_48;
  OLECHAR lower;
  byte *local_40;
  uint local_38;
  char16 local_32;
  int wT;
  OLECHAR ch;
  
  pbVar4 = *pp;
  end = *(byte **)(this + 0x4c8);
  this[0x508] = (Scanner<UTF8EncodingPolicyBase<false>>)((byte)this[0x508] & 0xf3);
  *(undefined4 *)(this + 0x51c) = 0;
  puVar11 = (undefined4 *)__tls_get_addr();
  local_40 = pbVar4;
  pSStack_48 = (Scanner<UTF8EncodingPolicyBase<false>_> *)this;
LAB_00f03221:
  pSVar7 = pSStack_48;
  pbVar4 = local_40 + 1;
  if (end <= local_40) {
    local_32 = L'\0';
LAB_00f03261:
    if (end < pbVar4) {
LAB_00f0385a:
      pSStack_48->m_currentCharacter = local_40;
      local_40 = pbVar4;
      Scanner<UTF8EncodingPolicyBase<false>_>::Error(pSStack_48,-0x7ff5fc09);
    }
LAB_00f0326a:
    local_40 = pbVar4;
    uVar14 = 0;
    goto LAB_00f0326d;
  }
  bVar2 = *local_40;
  uVar14 = (uint)bVar2;
  local_32 = (char16)bVar2;
  if (bVar2 < 0x22) {
    if (bVar2 == 0) goto LAB_00f03261;
    if ((bVar2 == 10) || (bVar2 == 0xd)) goto LAB_00f0385a;
LAB_00f03330:
    local_40 = pbVar4;
    if (-1 < (char)bVar2) goto LAB_00f0326d;
    cVar9 = utf8::DecodeTail((ushort)bVar2,&local_40,end,(DecodeOptions *)(this + 0x10),(bool *)0x0)
    ;
    uVar14 = (uint)(ushort)cVar9;
    (pSStack_48->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits =
         (size_t)(local_40 +
                 ((pSStack_48->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits - (long)pbVar4));
    goto LAB_00f03362;
  }
  if ((bVar2 != 0x22) && (bVar2 != 0x27)) {
    if (bVar2 != 0x5c) goto LAB_00f03330;
    bVar2 = pSStack_48->field_0x508;
    pSStack_48->field_0x508 = bVar2 | 8;
    pbVar1 = local_40 + 2;
    if (end <= pbVar4) {
      local_32 = L'\0';
LAB_00f03372:
      pbVar4 = pbVar1;
      if (end <= pbVar1) {
        hr = -0x7ff5fc09;
        local_40 = pbVar1;
        goto LAB_00f03889;
      }
      goto LAB_00f0326a;
    }
    bVar3 = *pbVar4;
    uVar14 = (uint)bVar3;
    local_32 = (char16)bVar3;
    uVar13 = (uint)bVar3;
    if (0x61 < bVar3) {
      switch(bVar3) {
      case 0x6e:
        local_32 = L'\n';
        uVar14 = 10;
        local_40 = pbVar1;
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
      case 0x77:
switchD_00f03397_caseD_6f:
        local_40 = pbVar1;
        if ((char)bVar3 < '\0') {
          local_32 = utf8::DecodeTail((ushort)bVar3,&local_40,end,(DecodeOptions *)(this + 0x10),
                                      (bool *)0x0);
          uVar14 = (uint)(ushort)local_32;
          (pSStack_48->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits =
               (size_t)(local_40 +
                       ((pSStack_48->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits -
                       (long)pbVar1));
          ch_00 = uVar14;
          if ((uVar14 & 0xfffe) == 0x2028) goto LAB_00f032f9;
        }
        break;
      case 0x72:
        local_32 = L'\r';
        uVar14 = 0xd;
        local_40 = pbVar1;
        break;
      case 0x74:
        local_32 = L'\t';
        uVar14 = 9;
        local_40 = pbVar1;
        break;
      case 0x75:
        local_32 = L'\0';
        local_40 = local_40 + 3;
        if (pbVar1 < end) {
          bVar2 = *pbVar1;
          BVar10 = Js::NumberUtilities::FHexDigit((ushort)bVar2,(int *)&local_38);
          if (BVar10 == 0) {
            if ((bVar2 == 0x7b) && (pSStack_48->es6UnicodeMode == true)) {
              hr = -0x7ff5fc01;
              if (local_40 < end) {
                cVar9 = (char16)*local_40;
              }
              else {
                cVar9 = L'\0';
              }
              local_40 = local_40 + 1;
              BVar10 = Js::NumberUtilities::FHexDigit(cVar9,(int *)&local_38);
              uVar14 = local_38;
              if (BVar10 != 0) {
                do {
                  if (local_40 < end) {
                    bVar2 = *local_40;
                    local_40 = local_40 + 1;
                    BVar10 = Js::NumberUtilities::FHexDigit((ushort)bVar2,(int *)&local_38);
                    if (BVar10 == 0) goto LAB_00f036fc;
                  }
                  else {
                    local_40 = local_40 + 1;
                    BVar10 = Js::NumberUtilities::FHexDigit(L'\0',(int *)&local_38);
                    if (BVar10 == 0) goto LAB_00f0387d;
                  }
                  uVar14 = uVar14 * 0x10 + local_38;
                  if (0x10ffff < uVar14) {
                    hr = -0x7ff5fbd9;
                    break;
                  }
                } while( true );
              }
              goto LAB_00f03889;
            }
          }
          else {
LAB_00f035d5:
            uVar14 = local_38;
            if (local_40 < end) {
              cVar9 = (char16)*local_40;
            }
            else {
              cVar9 = L'\0';
            }
            local_40 = local_40 + 1;
            BVar10 = Js::NumberUtilities::FHexDigit(cVar9,(int *)&local_38);
            if (BVar10 != 0) {
              iVar15 = local_38 * 0x100 + uVar14 * 0x1000;
              goto LAB_00f03616;
            }
          }
        }
        else {
          BVar10 = Js::NumberUtilities::FHexDigit(L'\0',(int *)&local_38);
          if (BVar10 != 0) goto LAB_00f035d5;
        }
        hr = -0x7ff5fc01;
        goto LAB_00f03889;
      case 0x76:
        local_32 = L'\v';
        uVar14 = 0xb;
        local_40 = pbVar1;
        break;
      case 0x78:
        local_32 = L'\0';
        iVar15 = 0;
        local_40 = pbVar1;
LAB_00f03616:
        if (local_40 < end) {
          cVar9 = (char16)*local_40;
        }
        else {
          cVar9 = L'\0';
        }
        local_40 = local_40 + 1;
        BVar10 = Js::NumberUtilities::FHexDigit(cVar9,(int *)&local_38);
        uVar14 = local_38;
        hr = -0x7ff5fc01;
        if (BVar10 == 0) goto LAB_00f03889;
        if (local_40 < end) {
          cVar9 = (char16)*local_40;
        }
        else {
          cVar9 = L'\0';
        }
        local_40 = local_40 + 1;
        BVar10 = Js::NumberUtilities::FHexDigit(cVar9,(int *)&local_38);
        if ((BVar10 == 0) || (uVar14 = uVar14 * 0x10 + iVar15 + local_38, 0xffff < uVar14))
        goto LAB_00f03889;
        goto LAB_00f03362;
      default:
        if (bVar3 == 0x66) {
          local_32 = L'\f';
          uVar14 = 0xc;
          local_40 = pbVar1;
        }
        else {
          if (uVar13 != 0x62) goto switchD_00f03397_caseD_6f;
          local_32 = L'\b';
          uVar14 = 8;
          local_40 = pbVar1;
        }
      }
      goto LAB_00f0326d;
    }
    if (uVar13 != 0x2f && 0x2e < bVar3) {
      if (bVar3 - 0x30 < 4) {
        uVar14 = (ushort)local_32 - 0x30;
        local_32 = (char16)uVar14;
        local_40 = local_40 + 3;
        if (pbVar1 < end) {
          local_38 = *pbVar1 - 0x30;
          uVar13 = local_38 & 0xffff;
          if ((local_38 & 0xffff) < 8) {
            pSStack_48->field_0x508 = bVar2 | 0xc;
            uVar14 = local_38 + uVar14 * 8;
            local_32 = (char16)uVar14;
            goto LAB_00f033dd;
          }
        }
        else {
          local_38 = 0xffffffd0;
          uVar13 = 0xffd0;
        }
        if ((local_32 != L'\0') || (local_40 = pbVar1, uVar13 < 10)) {
          pSStack_48->field_0x508 = bVar2 | 0xc;
          local_40 = pbVar1;
        }
      }
      else {
        if (3 < uVar13 - 0x34) goto switchD_00f03397_caseD_6f;
        uVar14 = (ushort)bVar3 - 0x30;
        local_32 = (char16)uVar14;
        pSStack_48->field_0x508 = bVar2 | 0xc;
        local_40 = pbVar1;
LAB_00f033dd:
        if (local_40 < end) {
          local_38 = *local_40 - 0x30;
          if ((local_38 & 0xfff8) == 0) {
            uVar14 = local_38 + uVar14 * 8;
            local_40 = local_40 + 1;
            goto LAB_00f03362;
          }
        }
        else {
          local_38 = 0xffffffd0;
        }
      }
      goto LAB_00f0326d;
    }
    if (uVar13 == 0) goto LAB_00f03372;
    ch_00 = (uint)bVar3;
    local_40 = pbVar1;
    if ((bVar3 != 10) && (uVar13 != 0xd)) goto switchD_00f03397_caseD_6f;
LAB_00f032f9:
    pSVar7 = pSStack_48;
    pSStack_48->m_currentCharacter = local_40;
    Scanner<UTF8EncodingPolicyBase<false>_>::ScanNewLine(pSStack_48,ch_00);
    local_40 = pSVar7->m_currentCharacter;
    goto LAB_00f03221;
  }
  local_40 = pbVar4;
  if (local_32 != delim) goto LAB_00f0326d;
  if ((pSStack_48->field_0x508 & 0x40) == 0) {
    prgch = (undefined1 (*) [16])(pSStack_48->m_tempChBuf).m_prgch;
    cch = (pSStack_48->m_tempChBuf).m_ichCur;
  }
  else {
    if (((pSStack_48->m_tempChBuf).m_ichCur != 10) ||
       (prgch = (undefined1 (*) [16])(pSStack_48->m_tempChBuf).m_prgch,
       *prgch != _DAT_011b2890 || ZEXT416(*(uint *)prgch[1]) != _DAT_011b2880)) {
      pTVar5 = pSStack_48->m_ptoken;
      *(double *)&pTVar5->u = 0.0;
      *(bool *)((long)&pTVar5->u + 8) = false;
      *(undefined7 *)((long)&pTVar5->u + 9) = 0;
      goto LAB_00f03809;
    }
    cch = 10;
  }
  pTVar5 = pSStack_48->m_ptoken;
  pIVar12 = HashTbl::PidHashNameLen<char16_t>(&pSStack_48->m_htbl,(char16_t *)prgch,cch);
  (pTVar5->u).field_0.pid = pIVar12;
  (pTVar5->u).field_0.pchMin = (char *)0x0;
LAB_00f03809:
  pSVar7->m_scanState = ScanStateNormal;
  pSVar7->field_0x508 = pSVar7->field_0x508 & 0xfd | (delim == L'\"') * '\x02';
  *pp = local_40;
  return tkStrCon;
LAB_00f036fc:
  if (bVar2 != 0x7d) {
LAB_00f0387d:
    hr = -0x7ff5fbd8;
LAB_00f03889:
    pSStack_48->m_currentCharacter = local_40 + -1;
    Scanner<UTF8EncodingPolicyBase<false>_>::Error(pSStack_48,hr);
  }
  if (uVar14 < 0x110000) {
    if (uVar14 < 0x10000) {
LAB_00f03362:
      local_32 = (char16)uVar14;
      goto LAB_00f0326d;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar11 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x4bd,"(codePoint <= 0x10FFFF)","codePoint <= 0x10FFFF");
    if (!bVar8) {
      pcVar6 = (code *)invalidInstructionException();
      (*pcVar6)();
    }
    *puVar11 = 0;
  }
  local_4a = L'\0';
  Js::NumberUtilities::CodePointAsSurrogatePair(uVar14,&local_4a,&local_32);
  Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>
            ((TemporaryBuffer *)(this + 0x510),(uint)(ushort)local_4a);
  uVar14 = (uint)(ushort)local_32;
LAB_00f0326d:
  Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>
            ((TemporaryBuffer *)(this + 0x510),uVar14 & 0xffff);
  goto LAB_00f03221;
}

Assistant:

tokens Scanner<EncodingPolicy>::ScanStringConstant(OLECHAR delim, EncodedCharPtr *pp)
{
    static_assert((stringTemplateMode && createRawString) || (!stringTemplateMode && !createRawString), "stringTemplateMode and createRawString must have the same value");

    OLECHAR ch, c, rawch;
    int wT;
    EncodedCharPtr p = *pp;
    EncodedCharPtr last = m_pchLast;

    // Reset
    m_OctOrLeadingZeroOnLastTKNumber = false;
    m_EscapeOnLastTkStrCon = FALSE;

    m_tempChBuf.Reset();

    // Use template parameter to gate raw string creation.
    // If createRawString is false, all these operations should be no-ops
    if (createRawString)
    {
        m_tempChBufSecondary.Reset();
    }

    for (;;)
    {
        switch ((rawch = ch = this->ReadFirst(p, last)))
        {
        case kchRET:
            if (stringTemplateMode)
            {
                if (this->PeekFirst(p, last) == kchNWL)
                {
                    // Eat the <LF> char, ignore return
                    this->ReadFirst(p, last);
                }

                // Both <CR> and <CR><LF> are normalized to <LF> in template cooked and raw values
                ch = rawch = kchNWL;
            }

            // Fall through
        case kchNWL:
            if (stringTemplateMode)
            {
                // Notify the scanner to update current line, number of lines etc
                NotifyScannedNewLine();

                // We haven't updated m_currentCharacter yet, so make sure the MinLine info is correct in case we error out.
                m_pchMinLine = p;

                break;
            }

            m_currentCharacter = p - 1;
            Error(ERRnoStrEnd);

        case '"':
        case '\'':
            if (ch == delim)
                goto LBreak;
            break;

        case '`':
            // In string template scan mode, don't consume the '`' - we need to differentiate
            // between a closed string template and the expression open sequence - ${
            if (stringTemplateMode)
            {
                p--;
                goto LBreak;
            }

            // If we aren't scanning for a string template, do the default thing
            goto LMainDefault;

        case '$':
            // If we are parsing a string literal part of a string template, ${ indicates we need to switch
            // to parsing an expression.
            if (stringTemplateMode && this->PeekFirst(p, last) == '{')
            {
                // Rewind to the $ and return
                p--;
                goto LBreak;
            }

            // If we aren't scanning for a string template, do the default thing
            goto LMainDefault;

        case kchNUL:
            if (p > last)
            {
                m_currentCharacter = p - 1;
                Error(ERRnoStrEnd);
            }
            break;

        default:
LMainDefault:
            if (this->IsMultiUnitChar(ch))
            {
                rawch = ch = this->template ReadRest<true>(ch, p, last);
            }
            break;

        case kchBSL:
            // In raw mode '\\' is not an escape character, just add the char into the raw buffer.
            m_tempChBufSecondary.template AppendCh<createRawString>(ch);

            m_EscapeOnLastTkStrCon=TRUE;

            // In raw mode, we append the raw char itself and not the escaped value so save the char.
            rawch = ch = this->ReadFirst(p, last);
            codepoint_t codePoint = 0;
            uint errorType = (uint)ERRbadHexDigit;
            switch (ch)
            {
            case 'b':
                ch = 0x08;
                break;
            case 't':
                ch = 0x09;
                break;
            case 'v':
                ch = 0x0B; //Only in ES5 mode
                break; //same as default
            case 'n':
                ch = 0x0A;
                break;
            case 'f':
                ch = 0x0C;
                break;
            case 'r':
                ch = 0x0D;
                break;
            case 'x':
                // Insert the 'x' here before jumping to parse the hex digits.
                m_tempChBufSecondary.template AppendCh<createRawString>(ch);

                // 2 hex digits
                ch = 0;
                goto LTwoHex;
            case 'u':
                // Raw string just inserts a 'u' here.
                m_tempChBufSecondary.template AppendCh<createRawString>(ch);

                ch = 0;
                if (Js::NumberUtilities::FHexDigit(c = this->ReadFirst(p, last), &wT))
                    goto LFourHex;
                else if (c != '{' || !this->es6UnicodeMode)
                    goto ReturnScanError;

                Assert(c == '{');
                // c should definitely be a '{' which should be appended to the raw string.
                m_tempChBufSecondary.template AppendCh<createRawString>(c);

                //At least one digit is expected
                if (!Js::NumberUtilities::FHexDigit(c = this->ReadFirst(p, last), &wT))
                {
                    goto ReturnScanError;
                }

                m_tempChBufSecondary.template AppendCh<createRawString>(c);

                codePoint = static_cast<codepoint_t>(wT);

                while(Js::NumberUtilities::FHexDigit(c = this->ReadFirst(p, last), &wT))
                {
                    m_tempChBufSecondary.template AppendCh<createRawString>(c);
                    codePoint <<= 4;
                    codePoint += static_cast<codepoint_t>(wT);

                    if (codePoint > 0x10FFFF)
                    {
                        errorType = (uint)ERRInvalidCodePoint;
                        goto ReturnScanError;
                    }
                }

                if (c != '}')
                {
                    errorType = (uint)ERRMissingCurlyBrace;
                    goto ReturnScanError;
                }

                Assert(codePoint <= 0x10FFFF);

                if (codePoint >= 0x10000)
                {
                    OLECHAR lower = 0;
                    Js::NumberUtilities::CodePointAsSurrogatePair(codePoint, &lower, &ch);
                    m_tempChBuf.AppendCh(lower);
                }
                else
                {
                    ch = (char16)codePoint;
                }

                // In raw mode we want the last hex character or the closing curly. c should hold one or the other.
                if (createRawString)
                    rawch = c;

                break;
LFourHex:
                codePoint = 0x0;
                // Append first hex digit character to the raw string.
                m_tempChBufSecondary.template AppendCh<createRawString>(c);

                codePoint += static_cast<codepoint_t>(wT * 0x1000);
                if (!Js::NumberUtilities::FHexDigit(c = this->ReadFirst(p, last), &wT))
                    goto ReturnScanError;

                // Append fourth (or second) hex digit character to the raw string.
                m_tempChBufSecondary.template AppendCh<createRawString>(c);

                codePoint += static_cast<codepoint_t>(wT * 0x0100);

LTwoHex:
                // This code path doesn't expect curly.
                if (!Js::NumberUtilities::FHexDigit(c = this->ReadFirst(p, last), &wT))
                    goto ReturnScanError;

                // Append first hex digit character to the raw string.
                m_tempChBufSecondary.template AppendCh<createRawString>(c);

                codePoint += static_cast<codepoint_t>(wT * 0x0010);

                if (!Js::NumberUtilities::FHexDigit(c = this->ReadFirst(p, last), &wT))
                    goto ReturnScanError;

                codePoint += static_cast<codepoint_t>(wT);

                // In raw mode we want the last hex character or the closing curly. c should hold one or the other.
                if (createRawString)
                    rawch = c;

                if (codePoint < 0x10000)
                {
                    ch = static_cast<OLECHAR>(codePoint);
                }
                else
                {
                    goto ReturnScanError;
                }
                break;
            case '0':
            case '1':
            case '2':
            case '3':
                // 1 to 3 octal digits

                ch -= '0';

                // Octal escape sequences are not allowed inside string template literals
                if (stringTemplateMode)
                {
                    c = this->PeekFirst(p, last);
                    if (ch != 0 || (c >= '0' && c <= '7'))
                    {
                        errorType = (uint)ERRES5NoOctal;
                        goto ReturnScanError;
                    }
                    break;
                }

                wT = (c = this->ReadFirst(p, last)) - '0';
                if ((char16)wT > 7)
                {
                    if (ch != 0 || ((char16)wT <= 9))
                    {
                        m_OctOrLeadingZeroOnLastTKNumber = true;
                    }
                    p--;
                    break;
                }

                m_OctOrLeadingZeroOnLastTKNumber = true;
                ch = static_cast< OLECHAR >(ch * 8 + wT);
                goto LOneOctal;
            case '4':
            case '5':
            case '6':
            case '7':
                // 1 to 2 octal digits

                // Octal escape sequences are not allowed inside string template literals
                if (stringTemplateMode)
                {
                    errorType = (uint)ERRES5NoOctal;
                    goto ReturnScanError;
                }

                ch -= '0';

                m_OctOrLeadingZeroOnLastTKNumber = true;

LOneOctal:
                wT = (c = this->ReadFirst(p, last)) - '0';
                if ((char16)wT > 7)
                {
                    p--;
                    break;
                }

                ch = static_cast< OLECHAR >(ch * 8 + wT);
                break;

            case kchRET:        // 0xD
                if (stringTemplateMode)
                {
                    // If this is \<CR><LF> we can eat the <LF> right now
                    if (this->PeekFirst(p, last) == kchNWL)
                    {
                        // Eat the <LF> char, ignore return
                        this->ReadFirst(p, last);
                    }

                    // Both \<CR> and \<CR><LF> are normalized to \<LF> in template raw string
                    rawch = kchNWL;
                }
            case kchLS:         // 0x2028, classifies as new line
            case kchPS:         // 0x2029, classifies as new line
            case kchNWL:        // 0xA
LEcmaEscapeLineBreak:
                if (stringTemplateMode)
                {
                    // We're going to ignore the line continuation tokens for the cooked strings, but we need to append the token for raw strings
                    m_tempChBufSecondary.template AppendCh<createRawString>(rawch);

                    // Template literal strings ignore all escaped line continuation tokens
                    NotifyScannedNewLine();

                    // We haven't updated m_currentCharacter yet, so make sure the MinLine info is correct in case we error out.
                    m_pchMinLine = p;

                    continue;
                }

                m_currentCharacter = p;
                ScanNewLine(ch);
                p = m_currentCharacter;
                continue;

            case 0:
                if (p >= last)
                {
                    errorType = (uint)ERRnoStrEnd;

ReturnScanError:
                    m_currentCharacter = p - 1;
                    Error(errorType);
                }
                else if (stringTemplateMode)
                {
                    // Escaped null character is translated into 0x0030 for raw template literals
                    rawch = 0x0030;
                }
                break;

            default:
                if (this->IsMultiUnitChar(ch))
                {
                    rawch = ch = this->template ReadRest<true>(ch, p, last);
                    switch (ch)
                    {
                    case kchLS:
                    case kchPS:
                        goto LEcmaEscapeLineBreak;
                    }
                }
                break;
            }
            break;
        }

        m_tempChBuf.AppendCh(ch);
        m_tempChBufSecondary.template AppendCh<createRawString>(rawch);
    }

LBreak:
    bool createPid = true;

    if ((m_DeferredParseFlags & ScanFlagSuppressStrPid) != 0)
    {
        createPid = false;

        if ((m_tempChBuf.m_ichCur == 10) && (0 == memcmp(_u("use strict"), m_tempChBuf.m_prgch, m_tempChBuf.m_ichCur * sizeof(OLECHAR))))
        {
            createPid = true;
        }
    }

    if (createPid)
    {
        m_ptoken->SetIdentifier(this->GetHashTbl()->PidHashNameLen(m_tempChBuf.m_prgch, m_tempChBuf.m_ichCur));
    }
    else
    {
        m_ptoken->SetIdentifier(NULL);
    }

    m_scanState = ScanStateNormal;
    m_doubleQuoteOnLastTkStrCon = '"' == delim;
    *pp = p;

    return tkStrCon;
}